

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O1

void io::write_world_to_rom(World *world,ROM *rom)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings;
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  unsigned_short uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  pointer ppMVar7;
  _Base_ptr p_Var8;
  pointer puVar9;
  pointer ppIVar10;
  EnemyType *pEVar11;
  HuffmanTree *this;
  pointer pMVar12;
  ColorPalette<13UL> *pCVar13;
  undefined8 uVar14;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *pmVar15;
  _Rb_tree_color _Var16;
  undefined4 uVar17;
  ColorPalette<6UL> *pCVar18;
  pointer ppHVar19;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> __last;
  uint8_t i;
  uint8_t uVar20;
  bool bVar21;
  undefined2 uVar22;
  uint16_t uVar23;
  uint32_t uVar24;
  int iVar25;
  mapped_type_conflict1 *pmVar26;
  _Base_ptr p_Var27;
  long lVar28;
  key_type pMVar29;
  Code *pCVar30;
  key_type pMVar31;
  _Rb_tree_node_base *p_Var32;
  mapped_type_conflict2 *pmVar33;
  _Rb_tree_node_base *p_Var34;
  ulong uVar35;
  _Base_ptr *pp_Var36;
  mapped_type *pmVar37;
  _Base_ptr p_Var38;
  byte *pbVar39;
  LandstalkerException *pLVar40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar41;
  _Base_ptr p_Var42;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar43;
  char cVar44;
  byte bVar45;
  EntityHighPalette *palette;
  pointer puVar46;
  size_t sVar47;
  ColorPalette<6UL> *this_00;
  undefined1 auVar48 [8];
  MapPalette *__range2;
  pointer ppIVar49;
  mapped_type mVar50;
  _Base_ptr p_Var51;
  pointer puVar52;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> __last_00
  ;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> _Var53;
  pointer ppCVar54;
  mapped_type_conflict2 mVar55;
  pointer ppMVar56;
  pointer pMVar57;
  char cVar58;
  pointer puVar59;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
  *__comp;
  long lVar60;
  initializer_list<unsigned_char> __l;
  map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
  blockset_addresses;
  ByteArray bytes;
  MapLayout *layout;
  ByteArray blockset_group_bytes;
  Blockset *blockset;
  ByteArray blockset_bytes;
  vector<EnemyType_*,_std::allocator<EnemyType_*>_> enemy_types;
  ByteArray high_palettes_bytes;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> drop_probabilities
  ;
  map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  map_layout_addresses;
  map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  instances_in_game;
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  drop_probability_lookup;
  undefined1 local_388 [12];
  uint uStack_37c;
  undefined1 local_378 [16];
  _Base_ptr p_Stack_368;
  _Base_ptr local_360;
  _Base_ptr local_358;
  _Base_ptr local_350;
  size_t local_348;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_340;
  World *local_310;
  undefined1 local_308 [12];
  undefined4 uStack_2fc;
  undefined1 local_2f8 [16];
  _Base_ptr local_2e8;
  _Base_ptr p_Stack_2e0;
  _Base_ptr local_2d8;
  _Base_ptr p_Stack_2d0;
  size_t local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_2c0;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  undefined1 local_258 [8];
  undefined8 uStack_250;
  _Base_ptr local_248;
  key_type local_228;
  key_type local_220;
  undefined1 local_218 [8];
  key_type pBStack_210;
  _Base_ptr local_208;
  undefined1 local_1e8 [8];
  pointer puStack_1e0;
  _Base_ptr local_1d8;
  key_type local_1b0;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  _Base_ptr local_198;
  _Base_ptr local_190;
  _Base_ptr p_Stack_188;
  _Base_ptr local_180;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_> local_178
  ;
  __normal_iterator<EnemyType_**,_std::vector<EnemyType_*,_std::allocator<EnemyType_*>_>_>
  _Stack_170;
  long local_168;
  undefined1 local_158 [8];
  void *pvStack_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Base_ptr p_Stack_138;
  _Base_ptr local_130;
  EnemyType **local_128;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_120;
  _Rb_tree<MapLayout_*,_std::pair<MapLayout_*const,_unsigned_int>,_std::_Select1st<std::pair<MapLayout_*const,_unsigned_int>_>,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
  local_f0;
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  local_c0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  local_90;
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  local_60;
  
  World::clean_unused_map_palettes(world);
  World::clean_unused_blocksets(world);
  World::clean_unused_layouts(world);
  md::ROM::mark_empty_chunk(rom,0xa2392,0x11c926);
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppMVar56 = (world->_map_layouts).super__Vector_base<MapLayout_*,_std::allocator<MapLayout_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppMVar7 = (world->_map_layouts).super__Vector_base<MapLayout_*,_std::allocator<MapLayout_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_310 = world;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppMVar56 != ppMVar7) {
    do {
      local_288 = (undefined1  [8])*ppMVar56;
      encode_map_layout((ByteArray *)local_308,(MapLayout *)local_288);
      stack0xfffffffffffffc80 = (pointer)0x0;
      local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
      local_388._0_8_ = local_378;
      uVar24 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                          (string *)local_388);
      if ((undefined1 *)local_388._0_8_ != local_378) {
        operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
      }
      pmVar26 = std::
                map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                ::operator[]((map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                              *)&local_f0,(key_type *)local_288);
      *pmVar26 = uVar24;
      if ((pointer)local_308._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
      }
      ppMVar56 = ppMVar56 + 1;
    } while (ppMVar56 != ppMVar7);
  }
  md::ROM::mark_empty_chunk(rom,0x1af804,0x1e0000);
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  p_Var38 = (_Base_ptr)(local_388 + 8);
  stack0xfffffffffffffc80 = (pointer)((ulong)stack0xfffffffffffffc80 & 0xffffffff00000000);
  local_378._0_8_ = (undefined1 *)0x0;
  local_378._8_8_ = p_Var38;
  p_Stack_368 = p_Var38;
  local_360 = (_Base_ptr)0x0;
  pMVar29 = (key_type)
            (local_310->_blockset_groups).
            super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_228 = (key_type)
              (local_310->_blockset_groups).
              super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar29 != local_228) {
    do {
      local_258 = (undefined1  [8])0x0;
      uStack_250 = (pointer)0x0;
      local_248 = (_Base_ptr)0x0;
      p_Var51 = *(_Base_ptr *)pMVar29;
      local_220 = pMVar29;
      p_Var8 = (_Base_ptr)
               (pMVar29->_foreground_tiles).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; p_Var51 != p_Var8; p_Var51 = (_Base_ptr)&p_Var51->_M_parent) {
        local_218 = *(undefined1 (*) [8])p_Var51;
        p_Var27 = p_Var38;
        for (p_Var42 = (_Base_ptr)local_378._0_8_; p_Var42 != (_Base_ptr)0x0;
            p_Var42 = (&p_Var42->_M_left)[*(Blockset **)(p_Var42 + 1) < (ulong)local_218]) {
          if (*(Blockset **)(p_Var42 + 1) >= (ulong)local_218) {
            p_Var27 = p_Var42;
          }
        }
        p_Var42 = p_Var38;
        if ((p_Var27 != p_Var38) &&
           (p_Var42 = p_Var27, (ulong)local_218 < *(Blockset **)(p_Var27 + 1))) {
          p_Var42 = p_Var38;
        }
        if (p_Var42 == p_Var38) {
          encode_blockset((ByteArray *)local_1e8,(Blockset *)local_218);
          stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
          local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
          local_308._0_8_ = local_2f8;
          uVar24 = md::ROM::inject_bytes
                             (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8
                              ,(string *)local_308);
          pmVar26 = std::
                    map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                    ::operator[]((map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                                  *)local_388,(key_type *)local_218);
          *pmVar26 = uVar24;
          if ((undefined1 *)local_308._0_8_ != local_2f8) {
            operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
          }
          if (local_1e8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
          }
        }
        pmVar26 = std::
                  map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                  ::operator[]((map<Blockset_*,_unsigned_int,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
                                *)local_388,(key_type *)local_218);
        ByteArray::add_long((ByteArray *)local_258,*pmVar26);
      }
      stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
      local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
      local_308._0_8_ = local_2f8;
      uVar24 = md::ROM::inject_bytes
                         (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                          (string *)local_308);
      pMVar29 = local_220;
      if ((undefined1 *)local_308._0_8_ != local_2f8) {
        operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
      }
      ByteArray::add_long((ByteArray *)local_288,uVar24);
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258,(long)local_248 - (long)local_258);
      }
      pMVar29 = (key_type)
                &(pMVar29->_foreground_tiles).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    } while (pMVar29 != local_228);
  }
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar24 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                      (string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  md::ROM::set_long(rom,0x1af800,uVar24);
  std::
  _Rb_tree<Blockset_*,_std::pair<Blockset_*const,_unsigned_int>,_std::_Select1st<std::pair<Blockset_*const,_unsigned_int>_>,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<Blockset_*,_std::pair<Blockset_*const,_unsigned_int>,_std::_Select1st<std::pair<Blockset_*const,_unsigned_int>_>,_std::less<Blockset_*>,_std::allocator<std::pair<Blockset_*const,_unsigned_int>_>_>
               *)local_388);
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  md::ROM::mark_empty_chunk(rom,0x29732,0x29a0a);
  local_1e8 = (undefined1  [8])0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (_Base_ptr)0x0;
  pMVar29 = (key_type)(local_310->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b0 = (key_type)&(local_310->_items)._M_t._M_impl.super__Rb_tree_header;
  if (pMVar29 != local_1b0) {
    do {
      local_218 = (undefined1  [8])0x0;
      pBStack_210 = (key_type)0x0;
      local_208 = (_Base_ptr)0x0;
      local_378._0_2_ = 0x20;
      stack0xfffffffffffffc80 = (pointer)0x1;
      local_388._0_8_ = local_378;
      stringtools::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_288,
                         (string *)
                         ((pMVar29->_background_tiles).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish + 8),(string *)local_388);
      local_228 = pMVar29;
      if ((undefined1 *)local_388._0_8_ != local_378) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
      }
      local_220 = (key_type)uStack_280;
      if (local_288 != (undefined1  [8])uStack_280) {
        puVar52 = (pointer)0x0;
        auVar48 = local_288;
        do {
          local_388._0_8_ = local_378;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_388,*(long *)auVar48,
                     (long)&((_Base_ptr)
                            (((key_type)auVar48)->_foreground_tiles).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start)->_M_color + *(long *)auVar48);
          cVar58 = (char)puVar52;
          if ((byte)(cVar58 - 7U) < 2) {
            local_308[0] = 0x6a;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,local_308);
            cVar58 = '\0';
          }
          cVar44 = cVar58 + '\x01';
          if (cVar58 == '\0') {
            cVar44 = '\0';
          }
          bVar45 = cVar44 + (char)stack0xfffffffffffffc80;
          if (bVar45 < 9) {
            if (cVar58 != '\0') {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_308," ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_388,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_308);
              if ((undefined1 *)local_308._0_8_ != local_2f8) {
                operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
              }
            }
            local_308._0_8_ = (pointer)0x0;
            stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
            local_2f8._0_8_ = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                       (size_type)stack0xfffffffffffffc80);
            if (stack0xfffffffffffffc80 != (pointer)0x0) {
              puVar59 = stack0xfffffffffffffc80 + local_388._0_8_;
              puVar52 = (pointer)local_388._0_8_;
              do {
                lVar28 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar28] == *puVar52) goto LAB_001b6565;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 0x6c);
                lVar28 = 0xff;
LAB_001b6565:
                local_258[0] = (char)lVar28;
                if ((char)lVar28 != -1) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  emplace_back<unsigned_char&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,
                             (uchar *)local_258);
                }
                puVar52 = puVar52 + 1;
              } while (puVar52 != puVar59);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,pBStack_210,
                       local_308._0_8_,stack0xfffffffffffffd00);
            if ((pointer)local_308._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
            }
            puVar52 = (pointer)(ulong)bVar45;
          }
          else if (stack0xfffffffffffffc80 < (pointer)0x9) {
            local_308[0] = 0x6a;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,
                       (uchar *)local_308);
            puVar52 = stack0xfffffffffffffc80;
            local_308._0_8_ = (pointer)0x0;
            stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
            local_2f8._0_8_ = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                       (size_type)stack0xfffffffffffffc80);
            if (stack0xfffffffffffffc80 != (pointer)0x0) {
              puVar46 = stack0xfffffffffffffc80 + local_388._0_8_;
              puVar59 = (pointer)local_388._0_8_;
              do {
                lVar28 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar28] == *puVar59) goto LAB_001b6651;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 0x6c);
                lVar28 = 0xff;
LAB_001b6651:
                local_258[0] = (char)lVar28;
                if ((char)lVar28 != -1) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  emplace_back<unsigned_char&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,
                             (uchar *)local_258);
                }
                puVar59 = puVar59 + 1;
              } while (puVar59 != puVar46);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,pBStack_210,
                       local_308._0_8_,stack0xfffffffffffffd00);
            if ((pointer)local_308._0_8_ != (pointer)0x0) {
              puVar59 = (pointer)(local_2f8._0_8_ - local_308._0_8_);
LAB_001b68db:
              operator_delete((void *)local_308._0_8_,(ulong)puVar59);
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_388,0,(ulong)(byte)(7 - cVar58));
            local_258 = (undefined1  [8])0x0;
            uStack_250 = (pointer)0x0;
            local_248 = (_Base_ptr)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                       (size_type)stack0xfffffffffffffd00);
            if (stack0xfffffffffffffd00 != (ColorPalette<6UL> *)0x0) {
              puVar59 = (pointer)((long)stack0xfffffffffffffd00 + local_308._0_8_);
              puVar52 = (pointer)local_308._0_8_;
              do {
                lVar28 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar28] == *puVar52) goto LAB_001b6733;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 0x6c);
                lVar28 = 0xff;
LAB_001b6733:
                local_1a8[0] = (char)lVar28;
                if ((char)lVar28 != -1) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  emplace_back<unsigned_char&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,
                             local_1a8);
                }
                puVar52 = puVar52 + 1;
              } while (puVar52 != puVar59);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,pBStack_210,
                       local_258,uStack_250);
            if (local_258 != (undefined1  [8])0x0) {
              operator_delete((void *)local_258,(long)local_248 - (long)local_258);
            }
            if ((undefined1 *)local_308._0_8_ != local_2f8) {
              operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
            }
            local_308[0] = 0x69;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,
                       (uchar *)local_308);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_388,(ulong)(byte)(7 - cVar58),0xffffffffffffffff);
            local_258 = (undefined1  [8])0x0;
            uStack_250 = (pointer)0x0;
            local_248 = (_Base_ptr)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                       (size_type)stack0xfffffffffffffd00);
            if (stack0xfffffffffffffd00 != (ColorPalette<6UL> *)0x0) {
              puVar59 = (pointer)((long)stack0xfffffffffffffd00 + local_308._0_8_);
              puVar52 = (pointer)local_308._0_8_;
              do {
                lVar28 = 0;
                do {
                  if ((&Symbols::TABLE)[lVar28] == *puVar52) goto LAB_001b684e;
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 0x6c);
                lVar28 = 0xff;
LAB_001b684e:
                local_1a8[0] = (char)lVar28;
                if ((char)lVar28 != -1) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  emplace_back<unsigned_char&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,
                             local_1a8);
                }
                puVar52 = puVar52 + 1;
              } while (puVar52 != puVar59);
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,pBStack_210,
                       local_258,uStack_250);
            if (local_258 != (undefined1  [8])0x0) {
              operator_delete((void *)local_258,(long)local_248 - (long)local_258);
            }
            puVar52 = (pointer)((ulong)stack0xfffffffffffffd00 & 0xff);
            if ((undefined1 *)local_308._0_8_ != local_2f8) {
              puVar59 = (pointer)(local_2f8._0_8_ + 1);
              goto LAB_001b68db;
            }
          }
          if ((undefined1 *)local_388._0_8_ != local_378) {
            operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
          }
          auVar48 = (undefined1  [8])&((key_type)auVar48)->_background_tiles;
        } while (auVar48 != (undefined1  [8])local_220);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288);
      local_388[0] = (string)((char)pBStack_210 - local_218[0]);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1e8,local_388);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1e8,puStack_1e0,
                 local_218,pBStack_210);
      pMVar29 = local_228;
      if (local_218 != (undefined1  [8])0x0) {
        operator_delete((void *)local_218,(long)local_208 - (long)local_218);
      }
      pMVar29 = (key_type)std::_Rb_tree_increment((_Rb_tree_node_base *)pMVar29);
    } while (pMVar29 != local_1b0);
  }
  stack0xfffffffffffffc80 = (pointer)0x0;
  local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
  local_388._0_8_ = local_378;
  uVar24 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,
                      (string *)local_388);
  if ((undefined1 *)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
  }
  local_358 = (_Base_ptr)&p_Stack_368;
  local_378._0_8_ = 0;
  local_388._0_8_ = (pointer)0x0;
  stack0xfffffffffffffc80 = (pointer)0x0;
  p_Stack_368 = (_Base_ptr)((ulong)p_Stack_368 & 0xffffffff00000000);
  local_360 = (_Base_ptr)0x0;
  local_348 = 0;
  local_340._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_340._M_impl.super__Rb_tree_header._M_header;
  local_340._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_340._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_280 = (ColorPalette<7UL> *)CONCAT71(uStack_280._1_7_,2);
  local_288 = (undefined1  [8])&PTR_getXn_00261c50;
  local_308._0_8_ = &PTR_getXn_00261cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)CONCAT44(2,uVar24);
  local_350 = local_358;
  local_340._M_impl.super__Rb_tree_header._M_header._M_right =
       local_340._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea((Code *)local_388,(Param *)local_308,(AddressRegister *)local_288);
  local_308._0_8_ = &PTR_getXn_00261cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x2000294b0;
  md::Code::jmp((Code *)local_388,(Param *)local_308);
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar24 = md::ROM::inject_code(rom,(Code *)local_388,(string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  _Stack_2c0._M_impl._0_8_ = 0;
  local_2e8 = (_Base_ptr)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = 0;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c8 = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288 = (undefined1  [8])&PTR_getXn_00261cd8;
  uStack_280 = (ColorPalette<7UL> *)CONCAT44(2,uVar24);
  local_2d8 = (_Base_ptr)&local_2e8;
  p_Stack_2d0 = (_Base_ptr)&local_2e8;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar30 = md::Code::jmp((Code *)local_308,(Param *)local_288);
  md::ROM::set_code(rom,0x294a2,pCVar30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_2c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2f8 + 8));
  pMVar29 = local_1b0;
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_340);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_378 + 8));
  if ((pointer)local_388._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
  }
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  pMVar31 = (key_type)(local_310->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pMVar31 != pMVar29) {
    do {
      puVar9 = (pMVar31->_background_tiles).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_388[0] = (string)((char)puVar9[0x1a] * '\x10' + (char)puVar9[0x18]);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_388);
      local_388[0] = (string)0xff;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_388);
      uVar4 = (pMVar31->_background_tiles).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish[0x19];
      local_388[0] = SUB21(uVar4 >> 8,0);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_388);
      local_388[0] = (string)(char)uVar4;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_388);
      pMVar31 = (key_type)std::_Rb_tree_increment((_Rb_tree_node_base *)pMVar31);
    } while (pMVar31 != pMVar29);
  }
  stack0xfffffffffffffc80 = (pointer)0x0;
  local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
  local_388._0_8_ = local_378;
  uVar24 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                      (string *)local_388);
  if ((undefined1 *)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
  }
  local_378._0_8_ = 0;
  local_388._0_8_ = (pointer)0x0;
  stack0xfffffffffffffc80 = (pointer)0x0;
  p_Stack_368 = (_Base_ptr)((ulong)p_Stack_368 & 0xffffffff00000000);
  local_360 = (_Base_ptr)0x0;
  local_358 = (_Base_ptr)&p_Stack_368;
  local_348 = 0;
  local_340._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_340._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_340._M_impl.super__Rb_tree_header._M_header;
  local_340._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00261c50;
  local_308._0_8_ = &PTR_getXn_00261cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)CONCAT44(2,uVar24);
  local_350 = local_358;
  local_340._M_impl.super__Rb_tree_header._M_header._M_right =
       local_340._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea((Code *)local_388,(Param *)local_308,(AddressRegister *)local_258);
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00261c50;
  puStack_1e0 = (pointer)((ulong)puStack_1e0 & 0xffffffffffffff00);
  local_1e8 = (undefined1  [8])&PTR_getXn_00261bb0;
  local_308._0_8_ = &PTR_getXn_00261d58;
  local_2f8._0_8_ = local_1e8;
  local_2f8._8_5_ = 1;
  pBStack_210 = (key_type)((ulong)pBStack_210 & 0xffffffffffffff00);
  local_218 = (undefined1  [8])&PTR_getXn_00261c50;
  unique0x1000445e = (ColorPalette<6UL> *)local_258;
  md::Code::lea((Code *)local_388,(Param *)local_308,(AddressRegister *)local_218);
  md::Code::add_word((Code *)local_388,0x201f);
  md::Code::rts((Code *)local_388);
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar24 = md::ROM::inject_code(rom,(Code *)local_388,(string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  _Stack_2c0._M_impl._0_8_ = 0;
  local_2e8 = (_Base_ptr)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = 0;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c8 = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_2c0._M_impl.super__Rb_tree_header._M_header;
  local_258 = (undefined1  [8])&PTR_getXn_00261cd8;
  uStack_250 = (pointer)CONCAT44(2,uVar24);
  local_2d8 = (_Base_ptr)&local_2e8;
  p_Stack_2d0 = (_Base_ptr)&local_2e8;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar30 = md::Code::jmp((Code *)local_308,(Param *)local_258);
  md::ROM::set_code(rom,0x292fc,pCVar30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_2c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2f8 + 8));
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_340);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_378 + 8));
  if ((pointer)local_388._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  if (0x800 < (ulong)((long)(local_310->_chest_contents).
                            super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(local_310->_chest_contents).
                           super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                           super__Vector_impl_data._M_start)) {
    pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_388._0_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,"Cannot declare more than 256 chests","");
    LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
    __cxa_throw(pLVar40,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  md::ROM::mark_empty_chunk(rom,0x9eabe,0x9eb9c);
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  ppIVar49 = (local_310->_chest_contents).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar10 = (local_310->_chest_contents).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar49 != ppIVar10) {
    do {
      if (*ppIVar49 == (Item *)0x0) {
        uVar20 = '?';
      }
      else {
        uVar20 = (*ppIVar49)->_id;
      }
      local_388[0] = (string)uVar20;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_288,local_388);
      ppIVar49 = ppIVar49 + 1;
    } while (ppIVar49 != ppIVar10);
  }
  stack0xfffffffffffffc80 = (pointer)0x0;
  local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
  local_388._0_8_ = local_378;
  uVar24 = md::ROM::inject_bytes
                     (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                      (string *)local_388);
  if ((undefined1 *)local_388._0_8_ != local_378) {
    operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
  }
  local_378._0_8_ = 0;
  local_388._0_8_ = (_Base_ptr)0x0;
  stack0xfffffffffffffc80 = (pointer)0x0;
  p_Stack_368 = (_Base_ptr)((ulong)p_Stack_368 & 0xffffffff00000000);
  local_360 = (_Base_ptr)0x0;
  local_358 = (_Base_ptr)&p_Stack_368;
  local_348 = 0;
  local_340._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_340._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_340._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_340._M_impl.super__Rb_tree_header._M_header;
  local_340._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00261c50;
  local_308._0_8_ = &PTR_getXn_00261cd8;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)CONCAT44(2,uVar24);
  local_350 = local_358;
  local_340._M_impl.super__Rb_tree_header._M_header._M_right =
       local_340._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea((Code *)local_388,(Param *)local_308,(AddressRegister *)local_258);
  uStack_250 = (pointer)((ulong)uStack_250 & 0xffffffffffffff00);
  local_258 = (undefined1  [8])&PTR_getXn_00261c50;
  puStack_1e0 = (pointer)CONCAT71(puStack_1e0._1_7_,1);
  local_1e8 = (undefined1  [8])&PTR_getXn_00261bb0;
  local_308._0_8_ = &PTR_getXn_00261d58;
  local_2f8._0_8_ = local_1e8;
  local_2f8._8_5_ = 1;
  pBStack_210 = (key_type)((ulong)pBStack_210 & 0xffffffffffffff00);
  local_218 = (undefined1  [8])&PTR_getXn_00261bb0;
  unique0x10004466 = (ColorPalette<6UL> *)local_258;
  md::Code::move((Code *)local_388,(Param *)local_308,(Param *)local_218,BYTE);
  md::Code::rts((Code *)local_388);
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_308._0_8_ = local_2f8;
  uVar24 = md::ROM::inject_code(rom,(Code *)local_388,(string *)local_308);
  if ((undefined1 *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  _Stack_2c0._M_impl._0_8_ = 0;
  local_2e8 = (_Base_ptr)0x0;
  p_Stack_2e0 = (_Base_ptr)0x0;
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = (void **)0x0;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c8 = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_2c0._M_impl.super__Rb_tree_header._M_header;
  local_258 = (undefined1  [8])&PTR_getXn_00261cd8;
  uStack_250 = (pointer)CONCAT44(2,uVar24);
  local_2d8 = (_Base_ptr)&local_2e8;
  p_Stack_2d0 = (_Base_ptr)&local_2e8;
  _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar30 = md::Code::jsr((Code *)local_308,(Param *)local_258);
  md::ROM::set_code(rom,0x9e776,pCVar30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_2c0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2f8 + 8));
  if ((pointer)local_308._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_340);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_378 + 8));
  if ((_Base_ptr)local_388._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
  }
  local_168 = 0;
  local_178._M_current = (EnemyType **)0x0;
  _Stack_170._M_current = (EnemyType **)0x0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var34 = (local_310->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220 = (key_type)&(local_310->_entity_types)._M_t._M_impl.super__Rb_tree_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((key_type)p_Var34 != local_220) {
    pmVar15 = &local_310->_maps;
    do {
      (*(code *)**(undefined8 **)p_Var34[1]._M_parent)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388);
      iVar25 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_388,"enemy");
      if ((_Base_ptr)local_388._0_8_ != (_Base_ptr)local_378) {
        operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
      }
      if (iVar25 == 0) {
        local_388._0_8_ = p_Var34[1]._M_parent;
        std::vector<EnemyType*,std::allocator<EnemyType*>>::emplace_back<EnemyType*&>
                  ((vector<EnemyType*,std::allocator<EnemyType*>> *)&local_178,
                   (EnemyType **)local_388);
        uVar22 = 1;
        if (*(char *)(local_388._0_8_ + 0x72) == '\0') {
          uVar22 = *(undefined2 *)(local_388._0_8_ + 0x70);
        }
        local_308._0_2_ = uVar22;
        std::
        _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
        ::_M_insert_unique<unsigned_short>(&local_120,(unsigned_short *)local_308);
        mVar55 = 0;
        for (p_Var32 = (local_310->_maps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var32 != &(pmVar15->_M_t)._M_impl.super__Rb_tree_header;
            p_Var32 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var32)) {
          p_Var38 = p_Var32[1]._M_parent[1]._M_left;
          p_Var51 = p_Var32[1]._M_parent[1]._M_right;
          if (p_Var38 != p_Var51) {
            do {
              mVar55 = mVar55 + (**(char **)p_Var38 == *(char *)&(p_Var34[1]._M_parent)->_M_parent);
              p_Var38 = (_Base_ptr)&p_Var38->_M_parent;
            } while (p_Var38 != p_Var51);
          }
        }
        pmVar33 = std::
                  map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  ::operator[]((map<EnemyType_*,_unsigned_short,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                                *)&local_c0,(key_type *)local_388);
        *pmVar33 = mVar55;
      }
      p_Var34 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var34);
    } while ((key_type)p_Var34 != local_220);
  }
  __last._M_current = _Stack_170._M_current;
  _Var53._M_current = local_178._M_current;
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::_Rb_tree(&local_60,&local_c0);
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
              *)local_158,&local_60);
  p_Var38 = (_Base_ptr)(local_388 + 8);
  if (local_148 == (_Base_ptr)0x0) {
    pp_Var36 = &local_360;
    stack0xfffffffffffffc80 = (pointer)((ulong)uStack_37c << 0x20);
    local_378._0_8_ = (pointer)0x0;
    local_378._8_8_ = p_Var38;
    p_Stack_368 = p_Var38;
  }
  else {
    stack0xfffffffffffffc80 = (pointer)CONCAT44(uStack_37c,(_Rb_tree_color)pvStack_150);
    local_378._0_8_ = local_148;
    local_378._8_8_ = local_140;
    p_Stack_368 = p_Stack_138;
    local_148->_M_parent = p_Var38;
    pp_Var36 = &local_130;
    local_360 = local_130;
    local_148 = (_Base_ptr)0x0;
    local_140 = (_Base_ptr)&pvStack_150;
    p_Stack_138 = (_Base_ptr)&pvStack_150;
  }
  *pp_Var36 = (_Base_ptr)0x0;
  if ((pointer)local_378._0_8_ == (pointer)0x0) {
    pp_Var36 = &local_180;
    uStack_1a0 = (pointer)((ulong)uStack_1a0._4_4_ << 0x20);
    local_198 = (_Base_ptr)0x0;
    local_190 = (_Base_ptr)&uStack_1a0;
    p_Stack_188 = (_Base_ptr)&uStack_1a0;
  }
  else {
    pp_Var36 = &local_360;
    uStack_1a0 = (pointer)CONCAT44(uStack_1a0._4_4_,local_388._8_4_);
    local_198 = (_Base_ptr)local_378._0_8_;
    local_190 = (_Base_ptr)local_378._8_8_;
    p_Stack_188 = p_Stack_368;
    *(_Base_ptr *)(local_378._0_8_ + 8) = (_Base_ptr)&uStack_1a0;
    local_180 = local_360;
    local_378._0_8_ = (pointer)0x0;
    local_378._8_8_ = p_Var38;
    p_Stack_368 = p_Var38;
  }
  *pp_Var36 = (_Base_ptr)0x0;
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
               *)local_388);
  if (_Var53._M_current != __last._M_current) {
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_1e8,
               (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_1a8);
    uVar35 = (long)__last._M_current - (long)_Var53._M_current >> 3;
    lVar28 = 0x3f;
    if (uVar35 != 0) {
      for (; uVar35 >> lVar28 == 0; lVar28 = lVar28 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
              (_Var53,__last,(ulong)(((uint)lVar28 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                *)local_1e8);
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                 *)local_1e8);
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_218,
               (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                *)local_1a8);
    if ((long)__last._M_current - (long)_Var53._M_current < 0x81) {
      __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                *)local_388;
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)__comp,
                 (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_218);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                (_Var53,__last,__comp);
    }
    else {
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_288,
                 (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_218);
      __last_00._M_current = _Var53._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Iter_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                (_Var53,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                  *)local_288);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                   *)local_288);
      std::
      _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
      ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_258,
                 (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                  *)local_218);
      if (__last_00._M_current != __last._M_current) {
        do {
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)local_308,
                     (_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                      *)local_258);
          if ((pointer)local_2f8._0_8_ == (pointer)0x0) {
            stack0xfffffffffffffc80 = (pointer)((ulong)uStack_37c << 0x20);
            local_378._0_8_ = (pointer)0x0;
            local_378._8_8_ = local_388 + 8;
            pp_Var36 = &local_360;
            p_Stack_368 = (_Base_ptr)local_378._8_8_;
          }
          else {
            stack0xfffffffffffffc80 = (pointer)CONCAT44(uStack_37c,local_308._8_4_);
            local_378._0_8_ = local_2f8._0_8_;
            local_378._8_8_ = local_2f8._8_8_;
            p_Stack_368 = local_2e8;
            *(undefined1 **)(local_2f8._0_8_ + 8) = local_388 + 8;
            local_360 = p_Stack_2e0;
            local_2f8._0_8_ = (pointer)0x0;
            pp_Var36 = &p_Stack_2e0;
            local_2f8._8_8_ = (_Base_ptr)(local_308 + 8);
            local_2e8 = (_Base_ptr)(local_308 + 8);
          }
          *pp_Var36 = (_Base_ptr)0x0;
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<EnemyType**,std::vector<EnemyType*,std::allocator<EnemyType*>>>,__gnu_cxx::__ops::_Val_comp_iter<write_entity_types(World_const&,md::ROM&)::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                      *)local_388);
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                       *)local_388);
          std::
          _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
          ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                       *)local_308);
          __last_00._M_current = __last_00._M_current + 1;
        } while (__last_00._M_current != __last._M_current);
      }
      __comp = (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Dinopony[P]randstalker_extlibs_landstalker_lib_landstalker_lib_io_world_rom_writer_cpp:178:9)>
                *)local_258;
    }
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                 *)__comp);
    std::
    _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
    ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
                 *)local_218);
  }
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
               *)local_1a8);
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree((_Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
               *)local_158);
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree(&local_60);
  if (8 < local_120._M_impl.super__Rb_tree_header._M_node_count) {
    pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_388._0_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,"Having more than 8 different loot probabilities is not allowed",
               "");
    LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
    __cxa_throw(pLVar40,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  if ((_Rb_tree_header *)local_120._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_120._M_impl.super__Rb_tree_header) {
    uVar24 = 0x199d6;
    mVar50 = '\0';
    p_Var38 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_388._0_2_ = (short)p_Var38[1]._M_color;
      pmVar37 = std::
                map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                ::operator[]((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                              *)&local_90,(key_type *)local_388);
      *pmVar37 = mVar50;
      md::ROM::set_word(rom,uVar24,local_388._0_2_);
      uVar24 = uVar24 + 2;
      p_Var38 = (_Base_ptr)std::_Rb_tree_increment(p_Var38);
      mVar50 = mVar50 + '\x01';
    } while ((_Rb_tree_header *)p_Var38 != &local_120._M_impl.super__Rb_tree_header);
  }
  local_128 = _Stack_170._M_current;
  if (local_178._M_current == _Stack_170._M_current) {
    uVar24 = 0x1b6f0;
  }
  else {
    pMVar29 = (key_type)0x1b6f0;
    _Var53._M_current = local_178._M_current;
    do {
      pEVar11 = *_Var53._M_current;
      bVar45 = 0x3f;
      if (pEVar11->_unkillable == false) {
        bVar45 = pEVar11->_dropped_item->_id & 0x3f;
      }
      local_1b0 = (key_type)CONCAT71(local_1b0._1_7_,bVar45);
      uVar23 = 1;
      if (pEVar11->_unkillable == false) {
        uVar23 = pEVar11->_drop_probability;
      }
      bVar45 = (pEVar11->super_EntityType).field_0x65;
      local_388._0_2_ = uVar23;
      pbVar39 = std::
                map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                ::at((map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
                      *)&local_90,(key_type *)local_388);
      bVar1 = *pbVar39;
      local_228 = pMVar29;
      md::ROM::set_byte(rom,(uint32_t)pMVar29,(pEVar11->super_EntityType)._id);
      iVar25 = (int)local_228;
      md::ROM::set_byte(rom,iVar25 + 1,(pEVar11->super_EntityType).field_0x64);
      md::ROM::set_byte(rom,iVar25 + 2,(pEVar11->super_EntityType).field_0x66);
      uVar20 = (pEVar11->super_EntityType).field_0x67;
      if (pEVar11->_unkillable != false) {
        uVar20 = '\0';
      }
      md::ROM::set_byte(rom,iVar25 + 3,uVar20);
      md::ROM::set_byte(rom,iVar25 + 4,(bVar1 & 4) << 5 | bVar45 & 0x7f);
      md::ROM::set_byte(rom,iVar25 + 5,bVar1 * '@' + (char)local_1b0);
      _Var53._M_current = _Var53._M_current + 1;
      pMVar29 = (key_type)(ulong)(iVar25 + 6);
    } while (_Var53._M_current != local_128);
    uVar24 = (int)local_228 + 6;
  }
  md::ROM::set_word(rom,uVar24,0xffff);
  if (uVar24 - 0x1b931 < 0xfffe46cd) {
    pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_388._0_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,"Enemy stats table is bigger than in original game","");
    LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
    __cxa_throw(pLVar40,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  std::
  _Rb_tree<EnemyType_*,_std::pair<EnemyType_*const,_unsigned_short>,_std::_Select1st<std::pair<EnemyType_*const,_unsigned_short>_>,_std::less<EnemyType_*>,_std::allocator<std::pair<EnemyType_*const,_unsigned_short>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_120);
  if (local_178._M_current != (EnemyType **)0x0) {
    operator_delete(local_178._M_current,local_168 - (long)local_178._M_current);
  }
  local_2f8._0_8_ = (ColorPalette<6UL> *)0x0;
  local_308._0_8_ = (ColorPalette<6UL> *)0x0;
  stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
  local_278[0]._M_allocated_capacity = (_Base_ptr)0x0;
  local_288 = (undefined1  [8])0x0;
  uStack_280 = (ColorPalette<7UL> *)0x0;
  local_248 = (_Base_ptr)0x0;
  local_258 = (undefined1  [8])0x0;
  uStack_250 = (pointer)0x0;
  p_Var34 = (local_310->_entity_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((key_type)p_Var34 != local_220) {
    do {
      if (*(char *)((long)&p_Var34[1]._M_parent[1]._M_left + 3) == '\0') {
        lVar28 = 0;
LAB_001b7a0f:
        if (lVar28 != 0x14) goto code_r0x001b7a15;
        pMVar29 = (key_type)
                  (((long)stack0xfffffffffffffd00 - local_308._0_8_ >> 3) * -0x5555555555555555);
        if (stack0xfffffffffffffd00 != (ColorPalette<6UL> *)local_308._0_8_) {
          lVar28 = 4;
          pMVar31 = (key_type)0x0;
          local_228 = pMVar29;
          do {
            uVar14 = local_308._0_8_;
            p_Var38 = p_Var34[1]._M_parent;
            bVar21 = Color::operator==((Color *)(local_308._0_8_ + (long)pMVar31 * 0x18),
                                       (Color *)&p_Var38[1]._M_left);
            if (bVar21) {
              lVar60 = 0;
              do {
                pMVar29 = pMVar31;
                if (lVar60 == 0x14) goto LAB_001b7b11;
                bVar21 = Color::operator==((Color *)(uVar14 + lVar60 + lVar28),
                                           (Color *)((long)&p_Var38[1]._M_left + lVar60 + 4));
                lVar60 = lVar60 + 4;
              } while (bVar21);
            }
            pMVar31 = (key_type)
                      ((long)&(((_Vector_base<Blockset_*,_std::allocator<Blockset_*>_> *)
                               &pMVar31->_offset)->_M_impl).super__Vector_impl_data._M_start + 1);
            lVar28 = lVar28 + 0x18;
            pMVar29 = local_228;
          } while (pMVar31 < (key_type)
                             (((long)stack0xfffffffffffffd00 - local_308._0_8_ >> 3) *
                             -0x5555555555555555));
        }
LAB_001b7b11:
        if (((ulong)pMVar29 & 0xff) ==
            ((long)stack0xfffffffffffffd00 - local_308._0_8_ >> 3) * -0x5555555555555555) {
          p_Var38 = p_Var34[1]._M_parent;
          if (stack0xfffffffffffffd00 == (ColorPalette<6UL> *)local_2f8._0_8_) {
            std::vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>>::
            _M_realloc_insert<ColorPalette<6ul>&>
                      ((vector<ColorPalette<6ul>,std::allocator<ColorPalette<6ul>>> *)local_308,
                       stack0xfffffffffffffd00,(ColorPalette<6UL> *)&p_Var38[1]._M_left);
          }
          else {
            _Var16 = p_Var38[2]._M_color;
            uVar17 = *(undefined4 *)&p_Var38[2].field_0x4;
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[4]._r = (char)_Var16;
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[4]._g = (char)(_Var16 >> 8);
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[4]._b = (char)(_Var16 >> 0x10);
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[4]._invalid =
                 (bool)(char)(_Var16 >> 0x18);
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[5]._r = (char)uVar17;
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[5]._g = (char)((uint)uVar17 >> 8);
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[5]._b =
                 (char)((uint)uVar17 >> 0x10);
            (unique0x100040b8->super_array<Color,_6UL>)._M_elems[5]._invalid =
                 (bool)(char)((uint)uVar17 >> 0x18);
            p_Var51 = p_Var38[1]._M_right;
            *(_Base_ptr *)(stack0xfffffffffffffd00->super_array<Color,_6UL>)._M_elems =
                 p_Var38[1]._M_left;
            *(_Base_ptr *)((stack0xfffffffffffffd00->super_array<Color,_6UL>)._M_elems + 2) =
                 p_Var51;
            unique0x00006b80 = stack0xfffffffffffffd00 + 1;
          }
        }
        local_388[0] = *(string *)&p_Var34[1]._M_color;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_388);
        local_388._0_8_ = CONCAT71(local_388._1_7_,(char)pMVar29) & 0xffffffffffffff7f;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_388);
      }
LAB_001b7b9d:
      if (*(char *)((long)&p_Var34[1]._M_parent[2]._M_parent + 3) == '\0') {
        lVar28 = 0;
LAB_001b7bad:
        if (lVar28 != 0x18) goto code_r0x001b7bb3;
        pMVar29 = (key_type)(((long)uStack_280 - (long)local_288 >> 2) * 0x6db6db6db6db6db7);
        if ((undefined1  [8])uStack_280 != local_288) {
          lVar28 = 4;
          pMVar31 = (key_type)0x0;
          local_228 = pMVar29;
          do {
            auVar48 = local_288;
            p_Var38 = p_Var34[1]._M_parent;
            bVar21 = Color::operator==((Color *)((long)local_288 + (long)pMVar31 * 0x1c),
                                       (Color *)&p_Var38[2]._M_parent);
            if (bVar21) {
              lVar60 = 0;
              do {
                pMVar29 = pMVar31;
                if (lVar60 == 0x18) goto LAB_001b7cb0;
                bVar21 = Color::operator==((Color *)((long)auVar48 + lVar60 + lVar28),
                                           (Color *)((long)&p_Var38[2]._M_parent + lVar60 + 4));
                lVar60 = lVar60 + 4;
              } while (bVar21);
            }
            pMVar31 = (key_type)
                      ((long)&(((_Vector_base<Blockset_*,_std::allocator<Blockset_*>_> *)
                               &pMVar31->_offset)->_M_impl).super__Vector_impl_data._M_start + 1);
            lVar28 = lVar28 + 0x1c;
            pMVar29 = local_228;
          } while (pMVar31 < (key_type)
                             (((long)uStack_280 - (long)local_288 >> 2) * 0x6db6db6db6db6db7));
        }
LAB_001b7cb0:
        if (((ulong)pMVar29 & 0xff) ==
            ((long)uStack_280 - (long)local_288 >> 2) * 0x6db6db6db6db6db7) {
          p_Var38 = p_Var34[1]._M_parent;
          if (uStack_280 == (ColorPalette<7UL> *)local_278[0]._0_8_) {
            std::vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>>::
            _M_realloc_insert<ColorPalette<7ul>&>
                      ((vector<ColorPalette<7ul>,std::allocator<ColorPalette<7ul>>> *)local_288,
                       uStack_280,(ColorPalette<7UL> *)&p_Var38[2]._M_parent);
          }
          else {
            p_Var51 = p_Var38[2]._M_parent;
            p_Var8 = p_Var38[2]._M_left;
            uVar14 = *(undefined8 *)((long)&p_Var38[2]._M_right + 4);
            *(undefined8 *)((uStack_280->super_array<Color,_7UL>)._M_elems + 3) =
                 *(undefined8 *)((long)&p_Var38[2]._M_left + 4);
            *(undefined8 *)((uStack_280->super_array<Color,_7UL>)._M_elems + 5) = uVar14;
            *(_Base_ptr *)(uStack_280->super_array<Color,_7UL>)._M_elems = p_Var51;
            *(_Base_ptr *)((uStack_280->super_array<Color,_7UL>)._M_elems + 2) = p_Var8;
            uStack_280 = uStack_280 + 1;
          }
        }
        local_388[0] = *(string *)&p_Var34[1]._M_color;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_388);
        local_388._0_8_ = CONCAT71(local_388._1_7_,(char)pMVar29) | 0x80;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_388);
      }
LAB_001b7d3f:
      p_Var34 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var34);
    } while ((key_type)p_Var34 != local_220);
  }
  local_388[0] = (string)0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_388);
  local_388[0] = (string)0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_258,local_388);
  uVar35 = (long)uStack_250 - (long)local_258;
  if (0x2a6 < uVar35) {
    pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_388._0_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,
               "Entity palette uses table must not be bigger than the one from base game","");
    LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
    __cxa_throw(pLVar40,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  local_1e8 = (undefined1  [8])0x0;
  puStack_1e0 = (pointer)0x0;
  local_1d8 = (_Base_ptr)0x0;
  if ((undefined1  [8])uStack_250 == local_258) {
    puVar52 = (pointer)0x0;
  }
  else {
    puVar52 = (pointer)operator_new(uVar35);
  }
  local_1d8 = (_Base_ptr)(puVar52 + uVar35);
  sVar47 = (long)uStack_250 - (long)local_258;
  local_1e8 = (undefined1  [8])puVar52;
  if (sVar47 != 0) {
    puStack_1e0 = puVar52;
    memmove(puVar52,(void *)local_258,sVar47);
  }
  puStack_1e0 = puVar52 + sVar47;
  md::ROM::set_bytes(rom,0x1a453a,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8
                    );
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  pCVar18 = stack0xfffffffffffffd00;
  local_218 = (undefined1  [8])0x0;
  pBStack_210 = (key_type)0x0;
  local_208 = (_Base_ptr)0x0;
  if ((ColorPalette<6UL> *)local_308._0_8_ != stack0xfffffffffffffd00) {
    this_00 = (ColorPalette<6UL> *)local_308._0_8_;
    do {
      ColorPalette<6UL>::to_bytes((ByteArray *)local_388,this_00);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_218,pBStack_210,
                 local_388._0_8_,stack0xfffffffffffffc80);
      if ((pointer)local_388._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar18);
  }
  uVar35 = (long)pBStack_210 - (long)local_218;
  if (uVar35 < 0x3c1) {
    local_1a8 = (undefined1  [8])0x0;
    uStack_1a0 = (pointer)0x0;
    local_198 = (_Base_ptr)0x0;
    if ((undefined1  [8])pBStack_210 == local_218) {
      puVar52 = (pointer)0x0;
    }
    else {
      puVar52 = (pointer)operator_new(uVar35);
    }
    local_198 = (_Base_ptr)(puVar52 + uVar35);
    sVar47 = (long)pBStack_210 - (long)local_218;
    local_1a8 = (undefined1  [8])puVar52;
    if (sVar47 != 0) {
      uStack_1a0 = puVar52;
      memmove(puVar52,(void *)local_218,sVar47);
    }
    uStack_1a0 = puVar52 + sVar47;
    md::ROM::set_bytes(rom,0x1a47e0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    if (local_1a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a8,(long)local_198 - (long)local_1a8);
    }
    pMVar29 = (key_type)uStack_280;
    local_158 = (undefined1  [8])0x0;
    pvStack_150 = (void *)0x0;
    local_148 = (_Base_ptr)0x0;
    if (local_288 != (undefined1  [8])uStack_280) {
      auVar48 = local_288;
      do {
        ColorPalette<7UL>::to_bytes((ByteArray *)local_388,(ColorPalette<7UL> *)auVar48);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_158,pvStack_150,
                   local_388._0_8_,stack0xfffffffffffffc80);
        if ((pointer)local_388._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
        }
        auVar48 = (undefined1  [8])
                  ((long)&(((key_type)auVar48)->_foreground_tiles).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      } while (auVar48 != (undefined1  [8])pMVar29);
    }
    uVar35 = (long)pvStack_150 - (long)local_158;
    if (uVar35 < 0xef) {
      local_388._0_8_ = (pointer)0x0;
      stack0xfffffffffffffc80 = (pointer)0x0;
      local_378._0_8_ = 0;
      if ((undefined1  [8])pvStack_150 == local_158) {
        puVar52 = (pointer)0x0;
      }
      else {
        puVar52 = (pointer)operator_new(uVar35);
      }
      local_378._0_8_ = puVar52 + uVar35;
      sVar47 = (long)pvStack_150 - (long)local_158;
      local_388._0_8_ = puVar52;
      if (sVar47 != 0) {
        unique0x1000439e = puVar52;
        memmove(puVar52,(void *)local_158,sVar47);
      }
      register0x000000b0 = puVar52 + sVar47;
      md::ROM::set_bytes(rom,0x1a4ba0,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388);
      if ((pointer)local_388._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
      }
      if (local_158 != (undefined1  [8])0x0) {
        operator_delete((void *)local_158,(long)local_148 - (long)local_158);
      }
      if (local_218 != (undefined1  [8])0x0) {
        operator_delete((void *)local_218,(long)local_208 - (long)local_218);
      }
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258,(long)local_248 - (long)local_258);
      }
      if (local_288 != (undefined1  [8])0x0) {
        operator_delete((void *)local_288,local_278[0]._M_allocated_capacity - (long)local_288);
      }
      if ((ColorPalette<6UL> *)local_308._0_8_ != (ColorPalette<6UL> *)0x0) {
        operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
      }
      strings = &local_310->_game_strings;
      build_trees_from_strings
                ((vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)local_258,strings);
      encode_huffman_trees
                ((ByteArray *)local_1e8,
                 (vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)local_258);
      uVar35 = (long)puStack_1e0 - (long)local_1e8;
      if (uVar35 < 0x93d) {
        local_308._0_8_ = (pointer)0x0;
        stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
        local_2f8._0_8_ = (pointer)0x0;
        if ((undefined1  [8])puStack_1e0 == local_1e8) {
          puVar52 = (pointer)0x0;
        }
        else {
          puVar52 = (pointer)operator_new(uVar35);
        }
        local_2f8._0_8_ = puVar52 + uVar35;
        sVar47 = (long)puStack_1e0 - (long)local_1e8;
        local_308._0_8_ = puVar52;
        if (sVar47 != 0) {
          unique0x1000446e = (ColorPalette<6UL> *)puVar52;
          memmove(puVar52,(void *)local_1e8,sVar47);
        }
        register0x000000b8 = (ColorPalette<6UL> *)(puVar52 + sVar47);
        md::ROM::set_bytes(rom,0x23d60,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308);
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
        }
        md::ROM::mark_empty_chunk(rom,0x2b27a,0x38600);
        encode_textbanks((vector<ByteArray,_std::allocator<ByteArray>_> *)local_288,strings,
                         (vector<HuffmanTree_*,_std::allocator<HuffmanTree_*>_> *)local_258);
        pMVar29 = (key_type)uStack_280;
        local_218 = (undefined1  [8])0x0;
        pBStack_210 = (key_type)0x0;
        local_208 = (_Base_ptr)0x0;
        if (local_288 != (undefined1  [8])uStack_280) {
          auVar48 = local_288;
          do {
            stack0xfffffffffffffc80 = (pointer)0x0;
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_388._0_8_ = local_378;
            uVar24 = md::ROM::inject_bytes
                               (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auVar48
                                ,(string *)local_388);
            if ((undefined1 *)local_388._0_8_ != local_378) {
              operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
            }
            ByteArray::add_long((ByteArray *)local_218,uVar24);
            auVar48 = (undefined1  [8])
                      &(((key_type)auVar48)->_foreground_tiles).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          } while (auVar48 != (undefined1  [8])pMVar29);
        }
        ByteArray::add_long((ByteArray *)local_218,0xffffffff);
        stack0xfffffffffffffc80 = (pointer)0x0;
        local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
        local_388._0_8_ = local_378;
        uVar24 = md::ROM::inject_bytes
                           (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                            (string *)local_388);
        if ((undefined1 *)local_388._0_8_ != local_378) {
          operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
        }
        md::ROM::set_long(rom,0x22e80,uVar24);
        ppHVar19 = uStack_250;
        for (auVar48 = local_258; auVar48 != (undefined1  [8])ppHVar19;
            auVar48 = (undefined1  [8])((long)auVar48 + 8)) {
          this = *(HuffmanTree **)auVar48;
          if (this != (HuffmanTree *)0x0) {
            HuffmanTree::~HuffmanTree(this);
            operator_delete(this,0x38);
          }
        }
        if (local_218 != (undefined1  [8])0x0) {
          operator_delete((void *)local_218,(long)local_208 - (long)local_218);
        }
        std::vector<ByteArray,_std::allocator<ByteArray>_>::~vector
                  ((vector<ByteArray,_std::allocator<ByteArray>_> *)local_288);
        if (local_1e8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
        }
        if (local_258 != (undefined1  [8])0x0) {
          operator_delete((void *)local_258,(long)local_248 - (long)local_258);
        }
        local_308._0_8_ = (pointer)0x0;
        stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
        local_2f8._0_8_ = (pointer)0x0;
        pMVar57 = (local_310->_map_connections).
                  super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar12 = (local_310->_map_connections).
                  super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pMVar57 != pMVar12) {
          do {
            uVar2 = pMVar57->_pos_x_1;
            uVar5 = pMVar57->_pos_y_1;
            local_288[3] = uVar5;
            local_288[2] = uVar2;
            uVar3 = pMVar57->_pos_x_2;
            uVar6 = pMVar57->_pos_y_2;
            local_288[7] = uVar6;
            local_288[6] = uVar3;
            local_288[1] = (char)pMVar57->_map_id_1;
            local_288[0] = pMVar57->_extra_byte_1 << 2 | (byte)(pMVar57->_map_id_1 >> 8) & 3;
            local_288[4] = pMVar57->_extra_byte_2 << 2 | (byte)(pMVar57->_map_id_2 >> 8) & 3;
            local_288[5] = (char)pMVar57->_map_id_2;
            __l._M_len = 8;
            __l._M_array = local_288;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,__l,
                       (allocator_type *)local_258);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,
                       stack0xfffffffffffffd00,local_388._0_8_,stack0xfffffffffffffc80);
            if ((pointer)local_388._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_388._0_8_,local_378._0_8_ - local_388._0_8_);
            }
            pMVar57 = pMVar57 + 1;
          } while (pMVar57 != pMVar12);
        }
        local_388[0] = (string)0xff;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_388);
        local_388[0] = (string)0xff;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_388);
        md::ROM::mark_empty_chunk(rom,0x11cea2,0x11ea64);
        stack0xfffffffffffffc80 = (pointer)0x0;
        local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
        local_388._0_8_ = local_378;
        uVar24 = md::ROM::inject_bytes
                           (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                            (string *)local_388);
        if ((undefined1 *)local_388._0_8_ != local_378) {
          operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
        }
        md::ROM::set_long(rom,0xa0a08,uVar24);
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
        }
        local_308._0_8_ = (pointer)0x0;
        stack0xfffffffffffffd00 = (ColorPalette<6UL> *)0x0;
        local_2f8._0_8_ = (pointer)0x0;
        ppCVar54 = (local_310->_map_palettes).
                   super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_220 = (key_type)
                    (local_310->_map_palettes).
                    super__Vector_base<ColorPalette<13UL>_*,_std::allocator<ColorPalette<13UL>_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if ((key_type)ppCVar54 != local_220) {
          do {
            pCVar13 = *ppCVar54;
            lVar28 = 0;
            do {
              uVar23 = Color::to_bgr_word((Color *)(&(pCVar13->super_array<Color,_13UL>)._M_elems[0]
                                                     ._r + lVar28));
              local_388[0] = SUB21(uVar23 >> 8,0);
              std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_388)
              ;
              local_388[0] = (string)(char)uVar23;
              std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_308,local_388)
              ;
              lVar28 = lVar28 + 4;
            } while (lVar28 != 0x34);
            ppCVar54 = ppCVar54 + 1;
          } while ((key_type)ppCVar54 != local_220);
        }
        md::ROM::mark_empty_chunk(rom,0x11c926,0x11cea2);
        stack0xfffffffffffffc80 = (pointer)0x0;
        local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
        local_388._0_8_ = local_378;
        uVar24 = md::ROM::inject_bytes
                           (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308,
                            (string *)local_388);
        if ((undefined1 *)local_388._0_8_ != local_378) {
          operator_delete((void *)local_388._0_8_,local_378._0_8_ + 1);
        }
        md::ROM::set_long(rom,0xa0a04,uVar24);
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_2f8._0_8_ - local_308._0_8_);
        }
        write_maps(local_310,rom,
                   (map<MapLayout_*,_unsigned_int,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
                    *)&local_f0);
        std::
        _Rb_tree<MapLayout_*,_std::pair<MapLayout_*const,_unsigned_int>,_std::_Select1st<std::pair<MapLayout_*const,_unsigned_int>_>,_std::less<MapLayout_*>,_std::allocator<std::pair<MapLayout_*const,_unsigned_int>_>_>
        ::~_Rb_tree(&local_f0);
        return;
      }
      pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string
                ((string *)local_288,(unsigned_long)(puStack_1e0 + (-0x93c - (long)local_1e8)));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     "New Huffman trees data size is ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      pbVar41 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308," bytes bigger than the original size");
      local_388._0_8_ = (pbVar41->_M_dataplus)._M_p;
      paVar43 = &pbVar41->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._0_8_ == paVar43) {
        local_378._0_8_ = paVar43->_M_allocated_capacity;
        local_378._8_8_ = *(long *)((long)&pbVar41->field_2 + 8);
        local_388._0_8_ = local_378;
      }
      else {
        local_378._0_8_ = paVar43->_M_allocated_capacity;
      }
      unique0x00012000 = (pointer)pbVar41->_M_string_length;
      (pbVar41->_M_dataplus)._M_p = (pointer)paVar43;
      pbVar41->_M_string_length = 0;
      (pbVar41->field_2)._M_local_buf[0] = '\0';
      LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
      __cxa_throw(pLVar40,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    local_388._0_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,
               "Entity high palettes table must not be bigger than the one from base game","");
    LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
    __cxa_throw(pLVar40,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  pLVar40 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  local_388._0_8_ = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,
             "Entity low palettes table must not be bigger than the one from base game","");
  LandstalkerException::LandstalkerException(pLVar40,(string *)local_388);
  __cxa_throw(pLVar40,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
code_r0x001b7a15:
  lVar60 = lVar28 + 7;
  lVar28 = lVar28 + 4;
  if (*(char *)((long)&p_Var34[1]._M_parent[1]._M_left + lVar60) != '\0') goto LAB_001b7b9d;
  goto LAB_001b7a0f;
code_r0x001b7bb3:
  lVar60 = lVar28 + 7;
  lVar28 = lVar28 + 4;
  if (*(char *)((long)&p_Var34[1]._M_parent[2]._M_parent + lVar60) != '\0') goto LAB_001b7d3f;
  goto LAB_001b7bad;
}

Assistant:

void io::write_world_to_rom(World& world, md::ROM& rom)
{
    world.clean_unused_map_palettes();
    world.clean_unused_blocksets();
    world.clean_unused_layouts();

    std::map<MapLayout*, uint32_t> map_layout_addresses = write_map_layouts(world, rom);
    write_blocksets(world, rom);
    write_item_names(world, rom);
    write_items(world, rom);
    write_chest_contents(world, rom);
    write_entity_types(world, rom);
    write_entity_type_palettes(world, rom);
    write_game_strings(world, rom);
    write_map_connections(world, rom);
    write_map_palettes(world, rom);
    write_maps(world, rom, map_layout_addresses);
}